

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sslexeme.cpp
# Opt level: O1

int IsStringFloat(char *str)

{
  long lVar1;
  bool bVar2;
  size_t sVar3;
  ulong uVar4;
  size_t sVar5;
  uint uVar6;
  bool bVar7;
  
  uVar6 = 0;
  if ((str != (char *)0x0) && (*str != '\0')) {
    sVar3 = strlen(str);
    bVar7 = sVar3 != 0;
    if (bVar7) {
      if ((byte)(*str - 0x30U) < 10 || (byte)(*str - 0x2dU) < 2) {
        uVar4 = 0;
        do {
          if (sVar3 - 1 == uVar4) goto LAB_001090ec;
          lVar1 = uVar4 + 1;
          uVar4 = uVar4 + 1;
        } while ((byte)(str[lVar1] - 0x2dU) < 2 || (byte)(str[lVar1] - 0x30U) < 10);
        bVar7 = uVar4 < sVar3;
      }
      if (bVar7) {
        return 0;
      }
    }
LAB_001090ec:
    if (sVar3 == 0) {
      uVar6 = 0;
    }
    else {
      sVar5 = 0;
      bVar7 = false;
      do {
        bVar2 = bVar7;
        if ((str[sVar5] == '.') && (bVar2 = true, bVar7)) {
          return 0;
        }
        bVar7 = bVar2;
        sVar5 = sVar5 + 1;
      } while (sVar3 != sVar5);
      uVar6 = (uint)bVar7;
    }
    if (1 < sVar3) {
      sVar5 = 1;
      do {
        if (str[sVar5] == '-') {
          return 0;
        }
        sVar5 = sVar5 + 1;
      } while (sVar3 != sVar5);
    }
  }
  return uVar6;
}

Assistant:

int IsStringFloat(const char* str)
{
    if (!str)
        return FALSE;

    if (strlen(str) == 0)
        return FALSE;

    for (int i = 0; i < strlen(str); i++)
    {
        if (!IsCharNumeric(str[i]) && str[i] != '-' && str[i] != '.')
            return FALSE;
    }

    int isRadixPointFound = 0;
    for (int i = 0; i < strlen(str); i++)
    {
        if (str[i] == '.')
        {
            if (isRadixPointFound)
                return FALSE;
            else
                isRadixPointFound = 1;
        }
    }

    for (int i = 1; i < strlen(str); i++)
    {
        if (str[i] == '-')
            return FALSE;
    }

    if (isRadixPointFound)
        return TRUE;
    else
        return FALSE;
}